

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid.cpp
# Opt level: O3

int __thiscall ncnn::Sigmoid::forward_inplace(Sigmoid *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    pvVar5 = bottom_top_blob->data;
    lVar6 = 0;
    do {
      if (0 < (int)uVar7) {
        uVar4 = 0;
        do {
          fVar8 = expf(-*(float *)((long)pvVar5 + uVar4 * 4));
          *(float *)((long)pvVar5 + uVar4 * 4) = 1.0 / (fVar8 + 1.0);
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
      }
      lVar6 = lVar6 + 1;
      pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = static_cast<float>(1.f / (1.f + exp(-ptr[i])));
        }
    }

    return 0;
}